

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

void vrna_md_defaults_backtrack_type(char t)

{
  uint uVar1;
  undefined7 in_register_00000039;
  
  uVar1 = (int)CONCAT71(in_register_00000039,t) - 0x43;
  if ((uVar1 < 0xb) && ((0x409U >> (uVar1 & 0x1f) & 1) != 0)) {
    defaults.backtrack_type = t;
    backtrack_type = t;
    return;
  }
  vrna_message_warning
            (
            "vrna_md_defaults_backtrack_type@model.c: Backtrack type must be any of \'F\', \'C\', or \'M\'. Not changing anything!"
            );
  return;
}

Assistant:

PUBLIC void
vrna_md_defaults_backtrack_type(char t)
{
  switch (t) {
    case 'M': /* fall through */
    case 'C': /* fall through */
    case 'F':
      defaults.backtrack_type = t;
#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
      backtrack_type = t;
#endif
      break;
    default:
      vrna_message_warning(
        "vrna_md_defaults_backtrack_type@model.c: Backtrack type must be any of 'F', 'C', or 'M'. Not changing anything!");
  }
}